

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O2

bool __thiscall
lzham::lzcompressor::greedy_parse(lzcompressor *this,parse_thread_state *parse_state)

{
  vector<lzham::lzcompressor::lzpriced_decision> *this_00;
  vector<lzham::lzcompressor::lzdecision> *this_01;
  uint uVar1;
  state *cur_state;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint max_match_len;
  lzpriced_decision *obj;
  uint ofs;
  
  (parse_state->super_raw_parse_thread_state).m_failed = true;
  (parse_state->super_raw_parse_thread_state).m_emit_decisions_backwards = false;
  ofs = (parse_state->super_raw_parse_thread_state).m_start_ofs;
  uVar1 = (parse_state->super_raw_parse_thread_state).m_bytes_to_match;
  cur_state = (parse_state->super_raw_parse_thread_state).m_pState;
  this_00 = &(parse_state->super_raw_parse_thread_state).m_temp_decisions;
  bVar2 = vector<lzham::lzcompressor::lzpriced_decision>::try_reserve(this_00,0x180);
  if (bVar2) {
    this_01 = &(parse_state->super_raw_parse_thread_state).m_best_decisions;
    uVar5 = 0;
    bVar2 = vector<lzham::lzcompressor::lzdecision>::try_resize(this_01,0,false);
    if (!bVar2) goto LAB_0010aeed;
    do {
      max_match_len = uVar1 - uVar5;
      if (uVar1 < uVar5 || max_match_len == 0) {
        (parse_state->super_raw_parse_thread_state).m_greedy_parse_total_bytes_coded = uVar5;
        (parse_state->super_raw_parse_thread_state).m_failed = false;
        (parse_state->super_raw_parse_thread_state).m_bytes_actually_parsed =
             (parse_state->super_raw_parse_thread_state).m_bytes_to_match;
        uVar5 = 1;
        goto LAB_0010aeed;
      }
      if (0xffff < max_match_len) {
        max_match_len = 0x10000;
      }
      uVar3 = enumerate_lz_decisions(this,ofs,cur_state,this_00,1,max_match_len);
      if ((int)uVar3 < 0) goto LAB_0010aeeb;
      obj = this_00->m_p + uVar3;
      bVar2 = vector<lzham::lzcompressor::lzdecision>::try_push_back(this_01,&obj->super_lzdecision)
      ;
      if (!bVar2) goto LAB_0010aeeb;
      state_base::partial_advance(&cur_state->super_state_base,&obj->super_lzdecision);
      iVar4 = (obj->super_lzdecision).m_len;
      iVar4 = iVar4 + (uint)(iVar4 == 0);
      ofs = ofs + iVar4;
      uVar5 = uVar5 + iVar4;
    } while ((parse_state->super_raw_parse_thread_state).m_best_decisions.m_size <
             (parse_state->super_raw_parse_thread_state).m_max_greedy_decisions);
    (parse_state->super_raw_parse_thread_state).m_greedy_parse_total_bytes_coded = uVar5;
    (parse_state->super_raw_parse_thread_state).m_bytes_actually_parsed = uVar5;
    (parse_state->super_raw_parse_thread_state).m_greedy_parse_gave_up = true;
  }
LAB_0010aeeb:
  uVar5 = 0;
LAB_0010aeed:
  return SUB41(uVar5,0);
}

Assistant:

bool lzcompressor::greedy_parse(parse_thread_state &parse_state)
   {
      parse_state.m_failed = true;
      parse_state.m_emit_decisions_backwards = false;

      const uint bytes_to_parse = parse_state.m_bytes_to_match;

      const uint lookahead_start_ofs = m_accel.get_lookahead_pos() & m_accel.get_max_dict_size_mask();

      uint cur_dict_ofs = parse_state.m_start_ofs;
      uint cur_lookahead_ofs = cur_dict_ofs - lookahead_start_ofs;
      uint cur_ofs = 0;

      state &approx_state = *parse_state.m_pState;

      lzham::vector<lzpriced_decision> &decisions = parse_state.m_temp_decisions;

      if (!decisions.try_reserve(384))
      {
         LZHAM_LOG_ERROR(7042);
         return false;
      }

      if (!parse_state.m_best_decisions.try_resize(0))
      {
         LZHAM_LOG_ERROR(7043);
         return false;
      }

      while (cur_ofs < bytes_to_parse)
      {
         const uint max_admissable_match_len = LZHAM_MIN(static_cast<uint>(CLZBase::cMaxHugeMatchLen), bytes_to_parse - cur_ofs);

         int largest_dec_index = enumerate_lz_decisions(cur_dict_ofs, approx_state, decisions, 1, max_admissable_match_len);
         if (largest_dec_index < 0)
         {
            LZHAM_LOG_ERROR(7044);
            return false;
         }

         const lzpriced_decision &dec = decisions[largest_dec_index];

         if (!parse_state.m_best_decisions.try_push_back(dec))
         {
            LZHAM_LOG_ERROR(7045);
            return false;
         }

         approx_state.partial_advance(dec);

         uint match_len = dec.get_len();
         LZHAM_ASSERT(match_len <= max_admissable_match_len);
         cur_dict_ofs += match_len;
         cur_lookahead_ofs += match_len;
         cur_ofs += match_len;

         if (parse_state.m_best_decisions.size() >= parse_state.m_max_greedy_decisions)
         {
            parse_state.m_greedy_parse_total_bytes_coded = cur_ofs;
            parse_state.m_bytes_actually_parsed = cur_ofs;
            parse_state.m_greedy_parse_gave_up = true;
            return false;
         }
      }

      parse_state.m_greedy_parse_total_bytes_coded = cur_ofs;

      LZHAM_ASSERT(cur_ofs == bytes_to_parse);

      parse_state.m_failed = false;
      parse_state.m_bytes_actually_parsed = parse_state.m_bytes_to_match;

      return true;
   }